

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode hostname_check(Curl_URL *u,char *hostname,size_t hlen)

{
  CURLUcode CVar1;
  size_t sVar2;
  
  if (hlen == 0) {
    CVar1 = CURLUE_NO_HOST;
  }
  else {
    if (*hostname == '[') {
      CVar1 = ipv6_parse(u,hostname,hlen);
      return CVar1;
    }
    sVar2 = strcspn(hostname," \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,+&()%");
    CVar1 = CURLUE_BAD_HOSTNAME;
    if (sVar2 == hlen) {
      CVar1 = CURLUE_OK;
    }
  }
  return CVar1;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname,
                                size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(hostname);

  if(!hlen)
    return CURLUE_NO_HOST;
  else if(hostname[0] == '[')
    return ipv6_parse(u, hostname, hlen);
  else {
    /* letters from the second string are not ok */
    len = strcspn(hostname, " \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,+&()%");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
  }
  return CURLUE_OK;
}